

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_binary_expr.hpp
# Opt level: O0

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
                    *other)

{
  ostream *poVar1;
  string *this;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  local_56 [11];
  string local_40 [39];
  ct_constant<5L> local_19;
  internal_rhs_type *local_18;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
  *other_local;
  ostream *stream_local;
  
  local_18 = (internal_rhs_type *)other;
  other_local = (ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
                 *)stream;
  poVar1 = std::operator<<(stream,"[");
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
  ::lhs((ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
         *)local_18);
  poVar1 = operator<<(poVar1,&local_19);
  this = local_40;
  op_mult<double>::str_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,this);
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
  ::rhs(local_18,(ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
                  *)this);
  poVar1 = operator<<(poVar1,local_56);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_40);
  return (ostream *)other_local;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_binary_expr<LHS, OP, RHS> const & other)
  {
    stream << "[" << other.lhs() << OP().str() << other.rhs() << "]";
    return stream;
  }